

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O2

bool __thiscall QRhiWidget::event(QRhiWidget *this,QEvent *e)

{
  QRhiWidgetPrivate *this_00;
  QRhi *pQVar1;
  bool bVar2;
  QSize QVar3;
  long in_FS_OFFSET;
  QRect local_40;
  QRegion local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QRhiWidgetPrivate **)&(this->super_QWidget).field_0x8;
  if (*(short *)(e + 8) == 0x11) {
    if ((((this->super_QWidget).data)->widget_attributes & 0x8000) != 0) {
      QVar3 = QWidget::size(&this->super_QWidget);
      local_40.x2.m_i = QVar3.wd.m_i.m_i + -1;
      local_40.x1.m_i = 0;
      local_40.y1.m_i = 0;
      local_40.y2.m_i = QVar3.ht.m_i.m_i + -1;
      QRegion::QRegion(&local_30,&local_40,Rectangle);
      QWidgetPrivate::sendPaintEvent(&this_00->super_QWidgetPrivate,&local_30);
      QRegion::~QRegion(&local_30);
    }
  }
  else if (*(short *)(e + 8) == 0xdd) {
    this_00->textureInvalid = true;
    pQVar1 = this_00->rhi;
    if ((pQVar1 != (QRhi *)0x0) && (pQVar1 != (this_00->offscreenRenderer).m_rhi)) {
      QRhi::removeCleanupCallback(pQVar1);
      (**(code **)(*(long *)&this->super_QWidget + 0x1b0))(this);
      QRhiWidgetPrivate::releaseResources(this_00);
    }
  }
  bVar2 = QWidget::event(&this->super_QWidget,e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QRhiWidget::event(QEvent *e)
{
    Q_D(QRhiWidget);
    switch (e->type()) {
    case QEvent::WindowAboutToChangeInternal:
        // The QRhi will almost certainly change, prevent texture() from
        // returning the existing QRhiTexture in the meantime.
        d->textureInvalid = true;

        if (d->rhi && d->rhi != d->offscreenRenderer.rhi()) {
            // Drop the cleanup callback registered to the toplevel's rhi and
            // do the early-release, there may not be another chance to do
            // this, and the QRhi we have currently set may be destroyed by the
            // time we get to ensureRhi() again.
            d->rhi->removeCleanupCallback(this);
            releaseResources(); // notify the user code about the early-release
            d->releaseResources();
            // must _not_ null out d->rhi here, for proper interaction with ensureRhi()
        }

        break;

    case QEvent::Show:
        if (isVisible())
            d->sendPaintEvent(QRect(QPoint(0, 0), size()));
        break;
    default:
        break;
    }
    return QWidget::event(e);
}